

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

AssertionExpr *
slang::ast::SimpleAssertionExpr::fromSyntax
          (SimpleSequenceExprSyntax *syntax,ASTContext *context,bool allowDisable)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  string_view arg;
  bool bVar1;
  SequenceRepetition *pSVar2;
  ClockingAssertionExpr *pCVar3;
  SimpleAssertionExpr *pSVar4;
  byte in_DL;
  Diagnostic *in_RSI;
  long in_RDI;
  ConstantValue evaluatedValue;
  Diagnostic *diag;
  AssertionExpr *targetExpr;
  AssertionInstanceExpression *aie;
  optional<slang::ast::SequenceRepetition> repetition;
  Expression *expr;
  Compilation *comp;
  Expression *in_stack_00000250;
  ASTContext *in_stack_00000258;
  Diagnostic *in_stack_fffffffffffffeb0;
  SourceLocation in_stack_fffffffffffffeb8;
  optional<slang::ast::SequenceRepetition> *in_stack_fffffffffffffec0;
  DiagCode noteCode;
  ASTContext *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  SourceLocation in_stack_fffffffffffffed8;
  Diagnostic *in_stack_fffffffffffffee0;
  Diagnostic *in_stack_fffffffffffffee8;
  Diagnostic *in_stack_fffffffffffffef0;
  undefined6 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 in_stack_fffffffffffffeff;
  ASTContext *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  Token local_c8;
  SourceLocation local_b8;
  undefined4 local_ac;
  size_t local_a8;
  char *local_a0;
  SourceRange local_98;
  undefined4 local_84;
  SourceLocation local_80;
  AssertionExpr *local_78;
  AssertionInstanceExpression *local_70;
  SourceRange local_68;
  undefined4 local_54;
  SourceRange local_50;
  undefined4 local_40;
  Expression *local_28;
  Compilation *local_20;
  byte local_11;
  Diagnostic *local_10;
  long local_8;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = ASTContext::getCompilation((ASTContext *)0x9afa8f);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x9afaa8);
  local_28 = bindExpr((ExpressionSyntax *)
                      CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                      in_stack_ffffffffffffff00,(bool)in_stack_fffffffffffffeff,
                      (bool)in_stack_fffffffffffffefe);
  std::optional<slang::ast::SequenceRepetition>::optional
            ((optional<slang::ast::SequenceRepetition> *)0x9afad4);
  if (*(long *)(local_8 + 0x20) == 0) {
    if ((local_28->kind == AssertionInstance) && ((local_11 & 1) == 0)) {
      local_70 = Expression::as<slang::ast::AssertionInstanceExpression>(local_28);
      noteCode = SUB84((ulong)in_stack_fffffffffffffec0 >> 0x20,0);
      local_78 = local_70->body;
      if (local_78->kind == Clocking) {
        pCVar3 = AssertionExpr::as<slang::ast::ClockingAssertionExpr>(local_78);
        local_78 = pCVar3->expr;
      }
      if (local_78->kind == DisableIff) {
        local_84 = 0x2d0008;
        local_98 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_ffffffffffffff00);
        sourceRange_01.startLoc._7_1_ = in_stack_fffffffffffffed7;
        sourceRange_01.startLoc._0_7_ = in_stack_fffffffffffffed0;
        sourceRange_01.endLoc = in_stack_fffffffffffffed8;
        local_80 = (SourceLocation)
                   ASTContext::addDiag(in_stack_fffffffffffffec8,SUB84((ulong)local_10 >> 0x20,0),
                                       sourceRange_01);
        local_a8 = (local_70->symbol->name)._M_len;
        local_a0 = (local_70->symbol->name)._M_str;
        arg._M_len._6_1_ = in_stack_fffffffffffffefe;
        arg._M_len._0_6_ = in_stack_fffffffffffffef8;
        arg._M_len._7_1_ = in_stack_fffffffffffffeff;
        arg._M_str = (char *)in_stack_ffffffffffffff00;
        Diagnostic::operator<<(in_stack_fffffffffffffef0,arg);
        in_stack_fffffffffffffee0 = local_10;
        if (local_78->syntax != (SyntaxNode *)0x0) {
          local_ac = 0x50001;
          in_stack_fffffffffffffed8 = local_80;
          local_c8 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)local_10);
          local_b8 = parsing::Token::location(&local_c8);
          Diagnostic::addNote(in_stack_fffffffffffffeb0,noteCode,in_stack_fffffffffffffeb8);
          in_stack_fffffffffffffee0 = local_10;
        }
      }
    }
  }
  else {
    std::optional<slang::ast::SequenceRepetition>::
    emplace<slang::syntax::SequenceRepetitionSyntax&,slang::ast::ASTContext_const&>
              (in_stack_fffffffffffffec0,(SequenceRepetitionSyntax *)in_stack_fffffffffffffeb8,
               (ASTContext *)in_stack_fffffffffffffeb0);
    if (local_28->kind == AssertionInstance) {
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x9afb2a)
      ;
      bVar1 = Type::isPropertyType((Type *)0x9afb32);
      if (bVar1) {
        local_40 = 0x360008;
        local_50 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_ffffffffffffff00);
        sourceRange.startLoc._7_1_ = in_stack_fffffffffffffed7;
        sourceRange.startLoc._0_7_ = in_stack_fffffffffffffed0;
        sourceRange.endLoc = in_stack_fffffffffffffed8;
        ASTContext::addDiag(in_stack_fffffffffffffec8,
                            SUB84((ulong)in_stack_fffffffffffffee0 >> 0x20,0),sourceRange);
        in_stack_fffffffffffffef0 = local_10;
      }
      else {
        pSVar2 = std::optional<slang::ast::SequenceRepetition>::operator->
                           ((optional<slang::ast::SequenceRepetition> *)0x9afba3);
        if (pSVar2->kind != Consecutive) {
          local_54 = 0x440008;
          local_68 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_ffffffffffffff00)
          ;
          sourceRange_00.startLoc._7_1_ = in_stack_fffffffffffffed7;
          sourceRange_00.startLoc._0_7_ = in_stack_fffffffffffffed0;
          sourceRange_00.endLoc = in_stack_fffffffffffffed8;
          ASTContext::addDiag(in_stack_fffffffffffffec8,
                              SUB84((ulong)in_stack_fffffffffffffee0 >> 0x20,0),sourceRange_00);
          in_stack_fffffffffffffee8 = local_10;
        }
      }
    }
  }
  ASTContext::tryEval(in_stack_00000258,in_stack_00000250);
  slang::ConstantValue::isFalse((ConstantValue *)in_stack_fffffffffffffeb0);
  pSVar4 = BumpAllocator::
           emplace<slang::ast::SimpleAssertionExpr,slang::ast::Expression_const&,std::optional<slang::ast::SequenceRepetition>&,bool>
                     ((BumpAllocator *)in_stack_fffffffffffffef0,
                      (Expression *)in_stack_fffffffffffffee8,
                      (optional<slang::ast::SequenceRepetition> *)in_stack_fffffffffffffee0,
                      (bool *)in_stack_fffffffffffffed8);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x9afe2b);
  return &pSVar4->super_AssertionExpr;
}

Assistant:

AssertionExpr& SimpleAssertionExpr::fromSyntax(const SimpleSequenceExprSyntax& syntax,
                                               const ASTContext& context, bool allowDisable) {
    auto& comp = context.getCompilation();
    auto& expr = bindExpr(*syntax.expr, context, /* allowInstances */ true);

    std::optional<SequenceRepetition> repetition;
    if (syntax.repetition) {
        repetition.emplace(*syntax.repetition, context);

        if (expr.kind == ExpressionKind::AssertionInstance) {
            if (expr.type->isPropertyType())
                context.addDiag(diag::PropInstanceRepetition, syntax.repetition->sourceRange());
            else if (repetition->kind != SequenceRepetition::Consecutive)
                context.addDiag(diag::SeqInstanceRepetition, syntax.repetition->sourceRange());
        }
    }
    else if (expr.kind == ExpressionKind::AssertionInstance && !allowDisable) {
        auto& aie = expr.as<AssertionInstanceExpression>();
        auto targetExpr = &aie.body;
        if (targetExpr->kind == AssertionExprKind::Clocking)
            targetExpr = &targetExpr->as<ClockingAssertionExpr>().expr;

        if (targetExpr->kind == AssertionExprKind::DisableIff) {
            auto& diag = context.addDiag(diag::NestedDisableIff, syntax.sourceRange());
            diag << aie.symbol.name;

            if (targetExpr->syntax) {
                diag.addNote(diag::NoteDeclarationHere,
                             targetExpr->syntax->getFirstToken().location());
            }
        }
    }

    const auto evaluatedValue = context.tryEval(expr);
    return *comp.emplace<SimpleAssertionExpr>(expr, repetition, evaluatedValue.isFalse());
}